

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_nbput_notify(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,Integer g_b,
                      Integer *ecoords,void *bufn,Integer *nbhandle)

{
  int iVar1;
  gai_putn_hdl_t *pgVar2;
  Integer IVar3;
  void *__dest;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t __size;
  int i;
  int iVar7;
  long lVar8;
  Integer ldn [7];
  
  ldn[1] = 0;
  ldn[4] = 0;
  ldn[5] = 0;
  ldn[2] = 0;
  ldn[3] = 0;
  ldn[6] = 0;
  ldn[0] = 1;
  if (putn_handles_initted == '\0') {
    memset(putn_handles,0,0xc80);
    putn_handles_initted = '\x01';
  }
  pgVar2 = putn_handles;
  lVar8 = 0;
  do {
    if (pgVar2->orighdl == (Integer *)0x0) goto LAB_0018e8d9;
    lVar8 = lVar8 + 1;
    pgVar2 = pgVar2 + 1;
  } while (lVar8 != 100);
  lVar8 = 0xffffffff;
LAB_0018e8d9:
  iVar7 = (int)lVar8;
  if (iVar7 == -1) {
    pnga_error("Too many outstanding put/notify operations!",0);
  }
  putn_handles[iVar7].orighdl = nbhandle;
  if (g_a == g_b) {
    IVar3 = pnga_ndim(g_a);
    if (0 < (int)(uint)IVar3) {
      uVar5 = 0;
      do {
        if ((ecoords[uVar5] < lo[uVar5]) || (hi[uVar5] < ecoords[uVar5])) goto LAB_0018ea6c;
        uVar5 = uVar5 + 1;
      } while (((uint)IVar3 & 0x7fffffff) != uVar5);
    }
    iVar1 = GA[g_a + 1000].elemsize;
    __size = (size_t)iVar1;
    IVar3 = pnga_ndim(g_a);
    lVar8 = *ecoords - *lo;
    if (1 < (int)(uint)IVar3) {
      lVar6 = 0;
      do {
        lVar8 = lVar8 + (ecoords[lVar6 + 1] - lo[lVar6 + 1]) * ld[lVar6];
        lVar6 = lVar6 + 1;
      } while ((ulong)((uint)IVar3 & 0x7fffffff) - 1 != lVar6);
    }
    if (lVar8 != ((long)bufn - (long)buf) / (long)__size) {
      pnga_error("Intersecting buffers, but notify element is not in buffer!",0);
    }
    __dest = malloc(__size);
    memcpy(__dest,bufn,__size);
    if (0 < iVar1) {
      sVar4 = 0;
      do {
        *(char *)((long)bufn + sVar4) = *(char *)((long)bufn + sVar4) + '\x01';
        sVar4 = sVar4 + 1;
      } while (__size != sVar4);
    }
    putn_handles[iVar7].elem_copy = __dest;
    ngai_put_common(g_a,lo,hi,buf,ld,0,-1,&putn_handles[iVar7].firsthdl);
    ngai_put_common(g_a,ecoords,ecoords,__dest,ldn,0,-1,&putn_handles[iVar7].elementhdl);
  }
  else {
LAB_0018ea6c:
    ngai_put_common(g_a,lo,hi,buf,ld,0,-1,&putn_handles[iVar7].firsthdl);
    ngai_put_common(g_b,ecoords,ecoords,bufn,ldn,0,-1,&putn_handles[iVar7].elementhdl);
    putn_handles[iVar7].elem_copy = (void *)0x0;
  }
  return;
}

Assistant:

void pnga_nbput_notify(Integer g_a, Integer *lo, Integer *hi, void *buf, Integer *ld, Integer g_b, Integer *ecoords, void *bufn, Integer *nbhandle)
{
  Integer ldn[MAXDIM] = { 1 };
  int pos, intersect;

  /* Make sure everything has been initialized */
  if (!putn_handles_initted) {
    memset(putn_handles, 0, sizeof(putn_handles));
    putn_handles_initted = 1;
  }

  pos = putn_find_empty_slot();
  if (pos == -1) /* no empty handles available */
    pnga_error("Too many outstanding put/notify operations!", 0);

  putn_handles[pos].orighdl = nbhandle; /* Store original handle for nbwait_notify */

  if (g_a == g_b)
    intersect = putn_intersect_coords(g_a, lo, hi, ecoords);
  else
    intersect = 0;

  if (!intersect) { /* Simpler case */
    ngai_put_common(g_a, lo, hi, buf, ld, 0, -1, &putn_handles[pos].firsthdl);
    ngai_put_common(g_b, ecoords, ecoords, bufn, ldn, 0, -1, &putn_handles[pos].elementhdl);

    putn_handles[pos].elem_copy = NULL;
  }
  else {
    int ret, i;
    Integer handle = GA_OFFSET + g_a, size;
    void *elem_copy;
    char *elem;

    size = GA[handle].elemsize;
    ret = putn_verify_element_in_buf(g_a, lo, hi, buf, ld, ecoords, bufn, size);

    if (!ret)
      pnga_error("Intersecting buffers, but notify element is not in buffer!", 0);

    elem_copy = malloc(size);
    memcpy(elem_copy, bufn, size);

    elem = bufn;
    for (i = 0; i < size; i++)
      elem[i] += 1; /* Increment each byte by one, safe? */

    putn_handles[pos].elem_copy = elem_copy;

    ngai_put_common(g_a, lo, hi, buf, ld, 0, -1, &putn_handles[pos].firsthdl);
    ngai_put_common(g_a, ecoords, ecoords, elem_copy, ldn, 0, -1,
		    &putn_handles[pos].elementhdl);
  }
}